

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

bool __thiscall SQCompiler::Compile(SQCompiler *this,SQObjectPtr *o)

{
  SQObjectType SVar1;
  int iVar2;
  SQFuncState *this_00;
  long *in_RDI;
  SQObject SVar3;
  SQInteger stacksize;
  SQFuncState funcstate;
  SQCompiler *in_stack_fffffffffffffd20;
  char *in_stack_fffffffffffffd28;
  SQSharedState *in_stack_fffffffffffffd30;
  SQInteger in_stack_fffffffffffffd38;
  SQFuncState *in_stack_fffffffffffffd40;
  SQObject *in_stack_fffffffffffffd48;
  SQOpcode _op;
  SQFuncState *in_stack_fffffffffffffd50;
  SQInteger in_stack_fffffffffffffd58;
  SQChar *in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd68;
  undefined4 in_stack_fffffffffffffd6c;
  SQFuncState *this_01;
  void *in_stack_fffffffffffffdd0;
  CompilerErrorFunc in_stack_fffffffffffffdd8;
  SQFuncState *in_stack_fffffffffffffde0;
  SQSharedState *in_stack_fffffffffffffde8;
  SQFuncState *in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffe2f;
  SQCompiler *in_stack_fffffffffffffe30;
  SQFuncState *in_stack_fffffffffffffea8;
  bool local_1;
  
  in_RDI[0x18] = 1;
  in_RDI[0x19] = 0;
  SQFuncState::SQFuncState
            (in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,in_stack_fffffffffffffde0,
             in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
  SQString::Create(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                   (SQInteger)in_stack_fffffffffffffd20);
  ::SQObjectPtr::operator=
            ((SQObjectPtr *)in_stack_fffffffffffffd30,(SQString *)in_stack_fffffffffffffd28);
  in_RDI[1] = (long)&stack0xfffffffffffffdd8;
  this_01 = (SQFuncState *)in_RDI[1];
  SQFuncState::CreateString
            ((SQFuncState *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
             in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  SQFuncState::AddParameter(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  SVar3 = SQFuncState::CreateString
                    ((SQFuncState *)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68),
                     in_stack_fffffffffffffd60,in_RDI[1]);
  SVar1 = SVar3._type;
  SQFuncState::AddParameter(in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
  *(undefined1 *)(in_RDI[1] + 0x40) = 1;
  ::SQObjectPtr::operator=
            ((SQObjectPtr *)in_stack_fffffffffffffd30,(SQObjectPtr *)in_stack_fffffffffffffd28);
  this_00 = (SQFuncState *)SQFuncState::GetStackSize((SQFuncState *)0x11e701);
  iVar2 = _setjmp((__jmp_buf_tag *)(in_RDI + 0x3f));
  if (iVar2 == 0) {
    Lex(in_stack_fffffffffffffd20);
    while (_op = (SQOpcode)((ulong)in_stack_fffffffffffffd48 >> 0x20), 0 < *in_RDI) {
      Statement(in_stack_fffffffffffffe30,(bool)in_stack_fffffffffffffe2f);
      if ((in_RDI[7] != 0x7d) && (in_RDI[7] != 0x3b)) {
        OptionalSemicolon(in_stack_fffffffffffffd20);
      }
    }
    SQFuncState::SetStackSize(this_01,CONCAT44(SVar1,in_stack_fffffffffffffd68));
    SQFuncState::AddLineInfos
              (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
               SUB81((ulong)in_stack_fffffffffffffd30 >> 0x38,0),
               SUB81((ulong)in_stack_fffffffffffffd30 >> 0x30,0));
    SQFuncState::AddInstruction
              (this_00,_op,(SQInteger)in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
               (SQInteger)in_stack_fffffffffffffd30,(SQInteger)in_stack_fffffffffffffd28);
    SQFuncState::SetStackSize(this_01,CONCAT44(SVar1,in_stack_fffffffffffffd68));
    SQFuncState::BuildProto(in_stack_fffffffffffffea8);
    ::SQObjectPtr::operator=
              ((SQObjectPtr *)in_stack_fffffffffffffd30,(SQFunctionProto *)in_stack_fffffffffffffd28
              );
    local_1 = true;
  }
  else {
    if (((*(byte *)((long)in_RDI + 0xb9) & 1) != 0) &&
       (*(long *)(*(long *)(in_RDI[0x58] + 0x118) + 0x140) != 0)) {
      in_stack_fffffffffffffd30 = *(SQSharedState **)(*(long *)(in_RDI[0x58] + 0x118) + 0x140);
      if ((int)in_RDI[2] == 0x8000010) {
        in_stack_fffffffffffffd28 = (char *)(in_RDI[3] + 0x38);
      }
      else {
        in_stack_fffffffffffffd28 = "unknown";
      }
      (*(code *)in_stack_fffffffffffffd30)
                (in_RDI[0x58],in_RDI + 0x1f,in_stack_fffffffffffffd28,in_RDI[8],in_RDI[10]);
    }
    in_stack_fffffffffffffd20 =
         (SQCompiler *)
         SQString::Create(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                          (SQInteger)in_stack_fffffffffffffd20);
    ::SQObjectPtr::operator=
              ((SQObjectPtr *)in_stack_fffffffffffffd30,(SQString *)in_stack_fffffffffffffd28);
    local_1 = false;
  }
  SQFuncState::~SQFuncState((SQFuncState *)in_stack_fffffffffffffd20);
  return local_1;
}

Assistant:

bool Compile(SQObjectPtr &o)
    {
        _debugline = 1;
        _debugop = 0;

        SQFuncState funcstate(_ss(_vm), NULL,ThrowError,this);
        funcstate._name = SQString::Create(_ss(_vm), _SC("main"));
        _fs = &funcstate;
        _fs->AddParameter(_fs->CreateString(_SC("this")));
        _fs->AddParameter(_fs->CreateString(_SC("vargv")));
        _fs->_varparams = true;
        _fs->_sourcename = _sourcename;
        SQInteger stacksize = _fs->GetStackSize();
        if(setjmp(_errorjmp) == 0) {
            Lex();
            while(_token > 0){
                Statement();
                if(_lex._prevtoken != _SC('}') && _lex._prevtoken != _SC(';')) OptionalSemicolon();
            }
            _fs->SetStackSize(stacksize);
            _fs->AddLineInfos(_lex._currentline, _lineinfo, true);
            _fs->AddInstruction(_OP_RETURN, 0xFF);
            _fs->SetStackSize(0);
            o =_fs->BuildProto();
#ifdef _DEBUG_DUMP
            _fs->Dump(_funcproto(o));
#endif
        }
        else {
            if(_raiseerror && _ss(_vm)->_compilererrorhandler) {
                _ss(_vm)->_compilererrorhandler(_vm, _compilererror, sq_type(_sourcename) == OT_STRING?_stringval(_sourcename):_SC("unknown"),
                    _lex._currentline, _lex._currentcolumn);
            }
            _vm->_lasterror = SQString::Create(_ss(_vm), _compilererror, -1);
            return false;
        }
        return true;
    }